

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_lanscapes_test.cpp
# Opt level: O3

void __thiscall
check_construction_of_landscape_form_gudhi_style_file::test_method
          (check_construction_of_landscape_form_gudhi_style_file *this)

{
  Persistence_landscape q;
  Persistence_landscape p;
  shared_count sStack_d0;
  Persistence_landscape local_c8;
  Persistence_landscape local_98;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  undefined **local_30;
  undefined1 local_28;
  undefined8 *local_20;
  char **local_18;
  
  Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
            (&local_98,"data/persistence_file_with_four_entries_per_line",1,0xffffffffffffffff);
  local_c8.land.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.number_of_functions_for_vectorization = 0;
  local_c8.land.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.land.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.number_of_functions_for_projections_to_reals = 0;
  Gudhi::Persistence_representations::Persistence_landscape::load_landscape_from_file
            (&local_c8,"data/persistence_file_with_four_entries_per_line_landscape");
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x28);
  Gudhi::Persistence_representations::Persistence_landscape::operator==(&local_98,&local_c8);
  sStack_d0.pi_ = (sp_counted_base *)0x0;
  local_18 = &local_60;
  local_60 = "p == q";
  local_58 = "";
  local_28 = 0;
  local_30 = &PTR__lazy_ostream_00116d20;
  local_20 = &boost::unit_test::lazy_ostream::inst;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_test.cpp"
  ;
  local_68 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d0);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector(&local_c8.land);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector(&local_98.land);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_construction_of_landscape_form_gudhi_style_file) {
  Persistence_landscape p("data/persistence_file_with_four_entries_per_line", 1);
  // p.print_to_file("persistence_file_with_four_entries_per_line_landscape");
  Persistence_landscape q;
  q.load_landscape_from_file("data/persistence_file_with_four_entries_per_line_landscape");
  BOOST_CHECK(p == q);
}